

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

Interface * __thiscall
gl4cts::EnhancedLayouts::Utils::ProgramInterface::CloneBlockForStage
          (ProgramInterface *this,Interface *block,STAGES stage,STORAGE storage,GLchar *prefix)

{
  GLchar *pGVar1;
  Interface *local_70;
  Interface *ptr;
  GLchar *stage_prefix;
  size_t position;
  string name;
  GLchar *prefix_local;
  STORAGE storage_local;
  STAGES stage_local;
  Interface *block_local;
  ProgramInterface *this_local;
  
  name.field_2._8_8_ = prefix;
  std::__cxx11::string::string((string *)&position,(string *)&block->m_name);
  stage_prefix = (GLchar *)0x0;
  pGVar1 = GetStagePrefix(stage,storage);
  replaceToken((GLchar *)name.field_2._8_8_,(size_t *)&stage_prefix,pGVar1,(string *)&position);
  pGVar1 = (GLchar *)std::__cxx11::string::c_str();
  local_70 = GetBlock(this,pGVar1);
  if (local_70 == (Interface *)0x0) {
    pGVar1 = (GLchar *)std::__cxx11::string::c_str();
    local_70 = AddInterface(this,pGVar1,BLOCK);
  }
  std::
  vector<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
  ::operator=(&local_70->m_members,&block->m_members);
  std::__cxx11::string::~string((string *)&position);
  return local_70;
}

Assistant:

Interface* ProgramInterface::CloneBlockForStage(const Interface& block, Shader::STAGES stage, Variable::STORAGE storage,
												const GLchar* prefix)
{
	/* Get name */
	std::string name = block.m_name;

	/* Prefix name with stage ID */
	size_t		  position	 = 0;
	const GLchar* stage_prefix = GetStagePrefix(stage, storage);
	Utils::replaceToken(prefix, position, stage_prefix, name);

	Interface* ptr = GetBlock(name.c_str());

	if (0 == ptr)
	{
		ptr = AddInterface(name.c_str(), Interface::BLOCK);
	}

	ptr->m_members = block.m_members;

	return ptr;
}